

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void run_container_intersection(run_container_t *src_1,run_container_t *src_2,run_container_t *dst)

{
  int iVar1;
  int iVar2;
  rle16_t *prVar3;
  rle16_t *prVar4;
  rle16_t *prVar5;
  _Bool _Var6;
  _Bool _Var7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  
  _Var6 = run_container_is_full(src_1);
  _Var7 = run_container_is_full(src_2);
  if (_Var7 || _Var6) {
    if (_Var6) {
      src_1 = src_2;
    }
    run_container_copy(src_1,dst);
    return;
  }
  iVar11 = src_2->n_runs + src_1->n_runs;
  if (dst->capacity < iVar11) {
    run_container_grow(dst,iVar11,false);
  }
  dst->n_runs = 0;
  prVar3 = src_1->runs;
  uVar9 = (uint)prVar3->value;
  uVar16 = prVar3->value + 1 + (uint)prVar3->length;
  prVar4 = src_2->runs;
  uVar13 = (uint)prVar4->value;
  uVar12 = (uint)prVar4->length + (uint)prVar4->value + 1;
  uVar10 = 0;
  iVar11 = 0;
  iVar14 = 0;
  do {
    iVar1 = src_1->n_runs;
    uVar15 = uVar16;
    while( true ) {
      while( true ) {
        if ((iVar1 <= iVar11) || (iVar2 = src_2->n_runs, iVar2 <= iVar14)) {
          return;
        }
        if (uVar13 < uVar15) break;
        iVar11 = iVar11 + 1;
        if (iVar11 < iVar1) {
          uVar9 = (uint)prVar3[iVar11].value;
          uVar15 = uVar9 + prVar3[iVar11].length + 1;
        }
      }
      if (uVar9 < uVar12) break;
      iVar14 = iVar14 + 1;
      if (iVar14 < iVar2) {
        uVar13 = (uint)prVar4[iVar14].value;
        uVar12 = uVar13 + prVar4[iVar14].length + 1;
      }
    }
    uVar8 = uVar13;
    if (uVar13 < uVar9) {
      uVar8 = uVar9;
    }
    uVar16 = uVar15;
    if (uVar15 == uVar12) {
      iVar11 = iVar11 + 1;
      if (iVar11 < iVar1) {
        uVar9 = (uint)prVar3[iVar11].value;
        uVar16 = uVar9 + prVar3[iVar11].length + 1;
      }
      iVar14 = iVar14 + 1;
      uVar12 = uVar15;
      if (iVar14 < iVar2) {
        uVar13 = (uint)prVar4[iVar14].value;
        uVar12 = prVar4[iVar14].length + uVar13 + 1;
      }
    }
    else if (uVar15 < uVar12) {
      iVar11 = iVar11 + 1;
      if (iVar11 < iVar1) {
        uVar9 = (uint)prVar3[iVar11].value;
        uVar16 = uVar9 + prVar3[iVar11].length + 1;
      }
    }
    else {
      iVar14 = iVar14 + 1;
      uVar15 = uVar12;
      if (iVar14 < iVar2) {
        uVar13 = (uint)prVar4[iVar14].value;
        uVar12 = prVar4[iVar14].length + uVar13 + 1;
      }
    }
    prVar5 = dst->runs;
    prVar5[uVar10].value = (ushort)uVar8;
    prVar5[uVar10].length = ~(ushort)uVar8 + (short)uVar15;
    uVar10 = uVar10 + 1;
    dst->n_runs = uVar10;
  } while( true );
}

Assistant:

void run_container_intersection(const run_container_t *src_1,
                                const run_container_t *src_2,
                                run_container_t *dst) {
    const bool if1 = run_container_is_full(src_1);
    const bool if2 = run_container_is_full(src_2);
    if (if1 || if2) {
        if (if1) {
            run_container_copy(src_2, dst);
            return;
        }
        if (if2) {
            run_container_copy(src_1, dst);
            return;
        }
    }
    // TODO: this could be a lot more efficient, could use SIMD optimizations
    const int32_t neededcapacity = src_1->n_runs + src_2->n_runs;
    if (dst->capacity < neededcapacity)
        run_container_grow(dst, neededcapacity, false);
    dst->n_runs = 0;
    int32_t rlepos = 0;
    int32_t xrlepos = 0;
    int32_t start = src_1->runs[rlepos].value;
    int32_t end = start + src_1->runs[rlepos].length + 1;
    int32_t xstart = src_2->runs[xrlepos].value;
    int32_t xend = xstart + src_2->runs[xrlepos].length + 1;
    while ((rlepos < src_1->n_runs) && (xrlepos < src_2->n_runs)) {
        if (end <= xstart) {
            ++rlepos;
            if (rlepos < src_1->n_runs) {
                start = src_1->runs[rlepos].value;
                end = start + src_1->runs[rlepos].length + 1;
            }
        } else if (xend <= start) {
            ++xrlepos;
            if (xrlepos < src_2->n_runs) {
                xstart = src_2->runs[xrlepos].value;
                xend = xstart + src_2->runs[xrlepos].length + 1;
            }
        } else {  // they overlap
            const int32_t lateststart = start > xstart ? start : xstart;
            int32_t earliestend;
            if (end == xend) {  // improbable
                earliestend = end;
                rlepos++;
                xrlepos++;
                if (rlepos < src_1->n_runs) {
                    start = src_1->runs[rlepos].value;
                    end = start + src_1->runs[rlepos].length + 1;
                }
                if (xrlepos < src_2->n_runs) {
                    xstart = src_2->runs[xrlepos].value;
                    xend = xstart + src_2->runs[xrlepos].length + 1;
                }
            } else if (end < xend) {
                earliestend = end;
                rlepos++;
                if (rlepos < src_1->n_runs) {
                    start = src_1->runs[rlepos].value;
                    end = start + src_1->runs[rlepos].length + 1;
                }

            } else {  // end > xend
                earliestend = xend;
                xrlepos++;
                if (xrlepos < src_2->n_runs) {
                    xstart = src_2->runs[xrlepos].value;
                    xend = xstart + src_2->runs[xrlepos].length + 1;
                }
            }
            dst->runs[dst->n_runs].value = (uint16_t)lateststart;
            dst->runs[dst->n_runs].length =
                (uint16_t)(earliestend - lateststart - 1);
            dst->n_runs++;
        }
    }
}